

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O0

bool __thiscall
BlurayHelper::writeBluRayFiles
          (BlurayHelper *this,MuxerManager *muxer,bool usedBlankPL,int mplsNum,int blankNum,
          bool stereoMode)

{
  uint8_t *puVar1;
  bool bVar2;
  byte bVar3;
  File *this_00;
  undefined8 uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined4 local_ac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_84;
  uint8_t *puStack_80;
  int i;
  uint8_t *V3metaData;
  AbstractOutputStream *file;
  byte local_5a;
  allocator<char> local_59;
  undefined1 local_58 [8];
  string prefix;
  int fileSize;
  bool stereoMode_local;
  int blankNum_local;
  int mplsNum_local;
  bool usedBlankPL_local;
  MuxerManager *muxer_local;
  BlurayHelper *this_local;
  
  prefix.field_2._12_4_ = 0x210;
  local_5a = 0;
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    std::__cxx11::string::string((string *)local_58,(string *)&this->m_dstPath);
  }
  else {
    std::allocator<char>::allocator();
    local_5a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator(&local_59);
  }
  if (this->m_isoWriter == (IsoWriter *)0x0) {
    this_00 = (File *)operator_new(0x38);
    File::File(this_00);
    V3metaData = (uint8_t *)this_00;
  }
  else {
    V3metaData = (uint8_t *)IsoWriter::createFile(this->m_isoWriter);
  }
  if (this->m_dt == BLURAY) {
    bVar2 = isV3();
    if (bVar2) {
      bdIndexData[5] = '3';
      prefix.field_2._12_4_ = 0x9c;
      bdIndexData[0xf] = 'x';
      puStack_80 = bdIndexData + 0x78;
      for (local_84 = 0; local_84 < 0x24; local_84 = local_84 + 1) {
        bdIndexData[(long)local_84 + 0x78] = ""[local_84];
      }
      bVar2 = is4K();
      if (bVar2) {
        bdIndexData[0x94] = 'Q';
      }
      bdIndexData[0x96] = (byte)V3_flags & 0x1e;
      if ((V3_flags & 0x1eU) == 0) {
        bdIndexData[0x96] = '\x01';
      }
    }
    else {
      bdIndexData[5] = '2';
      prefix.field_2._12_4_ = 0x78;
    }
  }
  else {
    bdIndexData[5] = '1';
    bdIndexData[0xf] = 'x';
  }
  puVar1 = V3metaData;
  bdIndexData[0x2c] = '\0';
  if (stereoMode) {
    bdIndexData[0x2c] = '`';
  }
  std::operator+(&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 "BDMV/index.bdmv");
  uVar4 = std::__cxx11::string::c_str();
  bVar3 = (**(code **)(*(long *)puVar1 + 0x10))(puVar1,uVar4,2,0);
  std::__cxx11::string::~string((string *)&local_a8);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    (**(code **)(*(long *)V3metaData + 0x28))(V3metaData,bdIndexData,prefix.field_2._12_4_);
    (**(code **)(*(long *)V3metaData + 0x18))();
    puVar1 = V3metaData;
    std::operator+(&local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   "BDMV/BACKUP/index.bdmv");
    uVar4 = std::__cxx11::string::c_str();
    bVar3 = (**(code **)(*(long *)puVar1 + 0x10))(puVar1,uVar4,2,0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      (**(code **)(*(long *)V3metaData + 0x28))(V3metaData,bdIndexData,prefix.field_2._12_4_);
      (**(code **)(*(long *)V3metaData + 0x18))();
      this_local._7_1_ =
           anon_unknown.dwarf_3633c::writeBdMovieObjectData
                     (muxer,(AbstractOutputStream *)V3metaData,(string *)local_58,this->m_dt,
                      usedBlankPL,mplsNum,blankNum);
    }
    else {
      if (V3metaData != (uint8_t *)0x0) {
        (**(code **)(*(long *)V3metaData + 8))();
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (V3metaData != (uint8_t *)0x0) {
      (**(code **)(*(long *)V3metaData + 8))();
    }
    this_local._7_1_ = false;
  }
  local_ac = 1;
  std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool BlurayHelper::writeBluRayFiles(const MuxerManager& muxer, const bool usedBlankPL, const int mplsNum,
                                    const int blankNum, const bool stereoMode) const
{
    int fileSize = sizeof(bdIndexData);
    const string prefix = m_isoWriter ? "" : m_dstPath;
    AbstractOutputStream* file;
    if (m_isoWriter)
        file = m_isoWriter->createFile();
    else
        file = new File();

    if (m_dt == DiskType::BLURAY)
    {
        if (isV3())
        {
            bdIndexData[5] = '3';
            fileSize = 0x9C;         // add 36 bytes for UHD data extension
            bdIndexData[15] = 0x78;  // start address of UHD data extension

            // UHD data extension
            uint8_t* V3metaData = bdIndexData + 0x78;
            static constexpr char metaData[37] =
                "\x00\x00\x00\x20\x00\x00\x00\x18\x00\x00\x00\x01"
                "\x00\x03\x00\x01\x00\x00\x00\x18\x00\x00\x00\x0C"
                "\x00\x00\x00\x08\x20\x00\x00\x00\x00\x00\x00\x00";
            for (int i = 0; i < 36; i++) V3metaData[i] = metaData[i];

            // 4K => 66/100 GB Disk, 109 MB/s Recording_Rate
            if (is4K())
                bdIndexData[0x94] = 0x51;
            // include HDR flags
            bdIndexData[0x96] = (V3_flags & 0x1e);
            // no HDR10 detected => SDR flag
            if (bdIndexData[0x96] == 0)
                bdIndexData[0x96] = 1;
        }
        else  // V2 Blu-ray
        {
            bdIndexData[5] = '2';
            fileSize = 0x78;
        }
    }
    else
    {
        bdIndexData[5] = '1';
        bdIndexData[15] = 0x78;
    }
    bdIndexData[0x2c] = stereoMode ? 0x60 : 0;  // set initial_output_mode_preference and SS_content_exist_flag

    if (!file->open((prefix + "BDMV/index.bdmv").c_str(), AbstractOutputStream::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    if (!file->open((prefix + "BDMV/BACKUP/index.bdmv").c_str(), File::ofWrite))
    {
        delete file;
        return false;
    }
    file->write(bdIndexData, fileSize);
    file->close();

    return writeBdMovieObjectData(muxer, file, prefix, m_dt, usedBlankPL, mplsNum, blankNum);
}